

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O1

void rsg::computeRandomValueRange(GeneratorState *state,ValueRangeAccess valueRange)

{
  Type TVar1;
  deRandom *rnd;
  deUint32 dVar2;
  deUint32 dVar3;
  deBool dVar4;
  deBool dVar5;
  runtime_error *this;
  uint uVar6;
  long lVar7;
  bool bVar8;
  float fVar9;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  rnd = &state->m_random->m_rnd;
  TVar1 = (valueRange.super_ConstValueRangeAccess.m_type)->m_baseType;
  if (TVar1 == TYPE_BOOL) {
    if (0 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements) {
      lVar7 = 0;
      do {
        dVar4 = deRandom_getBool(rnd);
        bVar8 = true;
        if (dVar4 != 1) {
          dVar5 = deRandom_getBool(rnd);
          bVar8 = dVar5 == 1;
        }
        VariableType::getElementType(valueRange.super_ConstValueRangeAccess.m_type);
        valueRange.super_ConstValueRangeAccess.m_min[lVar7].boolVal = dVar4 == 1;
        VariableType::getElementType(valueRange.super_ConstValueRangeAccess.m_type);
        valueRange.super_ConstValueRangeAccess.m_max[lVar7].boolVal = bVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements);
    }
  }
  else if (TVar1 == TYPE_INT) {
    if (0 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements) {
      lVar7 = 0;
      do {
        dVar2 = deRandom_getUint32(rnd);
        dVar3 = deRandom_getUint32(rnd);
        uVar6 = dVar3 % (0x21 - dVar2 % 0x21);
        VariableType::getElementType(valueRange.super_ConstValueRangeAccess.m_type);
        valueRange.super_ConstValueRangeAccess.m_min[lVar7].intVal = uVar6 - 0x10;
        VariableType::getElementType(valueRange.super_ConstValueRangeAccess.m_type);
        valueRange.super_ConstValueRangeAccess.m_max[lVar7].intVal = dVar2 % 0x21 + uVar6 + -0x10;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements);
    }
  }
  else {
    if (TVar1 != TYPE_FLOAT) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"computeRandomValueRange(): Unsupported type","");
      std::runtime_error::runtime_error(this,(string *)local_50);
      *(undefined ***)this = &PTR__runtime_error_021d12b8;
      __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    if (0 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements) {
      lVar7 = 0;
      do {
        dVar2 = deRandom_getUint32(rnd);
        dVar3 = deRandom_getUint32(rnd);
        fVar9 = (float)(int)(dVar3 % (0x141 - dVar2 % 0x141)) * 0.1 + -16.0;
        VariableType::getElementType(valueRange.super_ConstValueRangeAccess.m_type);
        valueRange.super_ConstValueRangeAccess.m_min[lVar7].floatVal = fVar9;
        VariableType::getElementType(valueRange.super_ConstValueRangeAccess.m_type);
        valueRange.super_ConstValueRangeAccess.m_max[lVar7].floatVal =
             (float)(dVar2 % 0x141) * 0.1 + fVar9;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (valueRange.super_ConstValueRangeAccess.m_type)->m_numElements);
    }
  }
  return;
}

Assistant:

void computeRandomValueRange (GeneratorState& state, ValueRangeAccess valueRange)
{
	const VariableType&	type	= valueRange.getType();
	de::Random&			rnd		= state.getRandom();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_BOOL:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				bool minVal = rnd.getBool();
				bool maxVal = minVal ? true : rnd.getBool();
				valueRange.getMin().component(ndx).asBool() = minVal;
				valueRange.getMax().component(ndx).asBool() = maxVal;
			}
			break;

		case VariableType::TYPE_INT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				const int minIntVal		= -16;
				const int maxIntVal		=  16;
				const int maxRangeLen	= maxIntVal - minIntVal;

				int rangeLen	= rnd.getInt(0, maxRangeLen);
				int minVal		= minIntVal + rnd.getInt(0, maxRangeLen-rangeLen);
				int maxVal		= minVal + rangeLen;

				valueRange.getMin().component(ndx).asInt() = minVal;
				valueRange.getMax().component(ndx).asInt() = maxVal;
			}
			break;

		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				const float step			= 0.1f;
				const int	maxSteps		= 320;
				const float minFloatVal		= -16.0f;

				int rangeLen	= rnd.getInt(0, maxSteps);
				int minStep		= rnd.getInt(0, maxSteps-rangeLen);

				float minVal	= minFloatVal + step*(float)minStep;
				float maxVal	= minVal + step*(float)rangeLen;

				valueRange.getMin().component(ndx).asFloat() = minVal;
				valueRange.getMax().component(ndx).asFloat() = maxVal;
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("computeRandomValueRange(): Unsupported type");
	}
}